

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void isofile_free_all_entries(iso9660_conflict *iso9660)

{
  isofile *piVar1;
  isofile *file_next;
  isofile *file;
  iso9660_conflict *iso9660_local;
  
  file_next = (iso9660->all_file_list).first;
  while (file_next != (isofile *)0x0) {
    piVar1 = file_next->allnext;
    isofile_free(file_next);
    file_next = piVar1;
  }
  return;
}

Assistant:

static void
isofile_free_all_entries(struct iso9660 *iso9660)
{
	struct isofile *file, *file_next;

	file = iso9660->all_file_list.first;
	while (file != NULL) {
		file_next = file->allnext;
		isofile_free(file);
		file = file_next;
	}
}